

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * LoadFrameInt(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  int value_00;
  bool bVar1;
  int value;
  uint offset_local;
  Storage *storage_local;
  InstructionVMEvalContext *ctx_local;
  VmType type_local;
  
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,4);
  if (bVar1) {
    value_00 = *(int *)((storage->data).data + offset);
    ctx_local._0_4_ = type.type;
    if ((VmValueType)ctx_local == VM_TYPE_POINTER) {
      type_local.structType =
           (TypeBase *)
           CreateConstantPointer
                     (ctx->allocator,(SynBase *)0x0,value_00,(VariableData *)0x0,type.structType,
                      false);
    }
    else {
      type_local.structType = (TypeBase *)CreateConstantInt(ctx->allocator,(SynBase *)0x0,value_00);
    }
  }
  else {
    type_local.structType =
         (TypeBase *)anon_unknown.dwarf_baae3::Report(ctx,"ERROR: out of stack space");
  }
  return (VmConstant *)type_local.structType;
}

Assistant:

VmConstant* LoadFrameInt(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	int value = 0;
	if(!storage->Reserve(ctx, offset, sizeof(value)))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(&value, storage->data.data + offset, sizeof(value));

	if(type.type == VM_TYPE_POINTER)
		return CreateConstantPointer(ctx.allocator, NULL, value, NULL, type.structType, false);

	return CreateConstantInt(ctx.allocator, NULL, value);
}